

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,value_type t)

{
  char *__s;
  size_t sVar1;
  
  __s = string_value(t);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  return os;
}

Assistant:

std::basic_ostream<CharT, CharTraitsT>& operator<<(std::basic_ostream<CharT, CharTraitsT>& os, value_type t) {
    return os << string_value(t);
}